

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# KM_fileio.cpp
# Opt level: O1

Result_t *
Kumu::ReadFileIntoBuffer
          (Result_t *__return_storage_ptr__,string *Filename,ByteString *Buffer,ui32_t param_3)

{
  fsize_t fVar1;
  ui32_t cap_size;
  ui32_t read_count;
  FileReader Reader;
  Result_t result;
  ui32_t local_12c;
  FileReader local_128;
  Result_t local_f8;
  Result_t local_90;
  
  fVar1 = FileSize(Filename);
  cap_size = (ui32_t)fVar1;
  ByteString::Capacity(&local_90,Buffer,cap_size);
  if (-1 < local_90.value) {
    local_12c = 0;
    FileReader::FileReader(&local_128);
    FileReader::OpenRead(&local_f8,&local_128,Filename);
    Result_t::operator=(&local_90,&local_f8);
    Result_t::~Result_t(&local_f8);
    if (-1 < local_90.value) {
      if (Buffer->m_Data == (byte_t *)0x0) {
        __assert_fail("m_Data",
                      "/workspace/llm4binary/github/license_c_cmakelists/cinecert[P]asdcplib/src/KM_util.h"
                      ,0x224,"byte_t *Kumu::ByteString::Data()");
      }
      FileReader::Read(&local_f8,&local_128,Buffer->m_Data,cap_size,&local_12c);
      Result_t::operator=(&local_90,&local_f8);
      Result_t::~Result_t(&local_f8);
    }
    if (-1 < local_90.value) {
      if (local_12c != cap_size) {
        Result_t::Result_t(__return_storage_ptr__,(Result_t *)RESULT_READFAIL);
        FileReader::~FileReader(&local_128);
        goto LAB_001153c2;
      }
      Buffer->m_Length = local_12c;
    }
    FileReader::~FileReader(&local_128);
  }
  Result_t::Result_t(__return_storage_ptr__,&local_90);
LAB_001153c2:
  Result_t::~Result_t(&local_90);
  return __return_storage_ptr__;
}

Assistant:

Result_t
Kumu::ReadFileIntoBuffer(const std::string& Filename, Kumu::ByteString& Buffer, ui32_t)
{
  ui32_t file_size = FileSize(Filename);
  Result_t result = Buffer.Capacity(file_size);

  if ( KM_SUCCESS(result) )
    {
      ui32_t read_count = 0;
      FileReader Reader;

      result = Reader.OpenRead(Filename);

      if ( KM_SUCCESS(result) )
	result = Reader.Read(Buffer.Data(), file_size, &read_count);
    
      if ( KM_SUCCESS(result) )
	{
	  if ( file_size != read_count) 
	    return RESULT_READFAIL;

	  Buffer.Length(read_count);
	}
    }
  
  return result;
}